

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseAssetIdentifier
          (AsciiParser *this,AssetPath *out,bool *triple_deliminated)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint8_t uVar2;
  byte bVar3;
  byte bVar4;
  ulong uVar5;
  StreamReader *pSVar6;
  bool bVar7;
  AssetPath *pAVar8;
  bool *pbVar9;
  bool bVar10;
  int iVar11;
  long lVar12;
  ostream *poVar13;
  long *plVar14;
  size_type *psVar15;
  int iVar16;
  bool bVar17;
  string tok;
  vector<char,_std::allocator<char>_> buf;
  ostringstream ss_e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  AssetPath *local_210;
  string local_208;
  vector<char,_std::allocator<char>_> local_1e8;
  bool *local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [32];
  _Alloc_hider local_188;
  size_type local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178 [4];
  ios_base local_138 [264];
  
  local_1e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (char *)0x0;
  local_1e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uVar5 = this->_sr->idx_;
  bVar10 = SkipWhitespaceAndNewline(this,true);
  if (bVar10) {
    bVar10 = CharN(this,3,&local_1e8);
    if ((((bVar10) &&
         (*local_1e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
           ._M_start == '@')) &&
        (local_1e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start[1] == '@')) &&
       (local_1e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start[2] == '@')) {
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      local_230._M_string_length = 0;
      local_230.field_2._M_local_buf[0] = 0;
      bVar10 = false;
      bVar17 = false;
      iVar16 = 0;
      local_210 = out;
      do {
        pSVar6 = this->_sr;
        uVar5 = pSVar6->idx_;
        if ((pSVar6->length_ <= uVar5) || (pSVar6->binary_[uVar5] == '\0')) goto LAB_003b47d0;
        if (pSVar6->length_ < uVar5 + 1) {
          iVar11 = 1;
LAB_003b429d:
          bVar7 = false;
        }
        else {
          uVar2 = pSVar6->binary_[uVar5];
          pSVar6->idx_ = uVar5 + 1;
          if (uVar2 == '\\') {
            bVar17 = true;
          }
          if (uVar2 == '@') {
            iVar16 = iVar16 + 1;
          }
          else {
            if (iVar16 < 2) {
              iVar16 = 1;
            }
            iVar16 = iVar16 + -1;
          }
          ::std::__cxx11::string::push_back((char)&local_230);
          iVar11 = 0;
          if (iVar16 == 3) {
            if (!bVar17) {
              iVar16 = 3;
              bVar10 = true;
              iVar11 = 7;
              goto LAB_003b429d;
            }
            bVar7 = true;
            if (local_230._M_string_length < 4) {
              bVar17 = false;
              iVar16 = 0;
            }
            else {
              local_1a8._0_8_ = local_1a8 + 0x10;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"\\@@@","");
              if (local_230._M_string_length < (ulong)local_1a8._8_8_) {
                bVar17 = false;
              }
              else {
                lVar12 = ::std::__cxx11::string::find
                                   ((char *)&local_230,local_1a8._0_8_,
                                    local_230._M_string_length - local_1a8._8_8_);
                bVar17 = lVar12 != -1;
              }
              if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
                operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
              }
              if (bVar17) {
                if (local_230._M_string_length < 4) {
                  ::std::__throw_out_of_range_fmt
                            ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                             "basic_string::erase");
                }
                local_230._M_dataplus._M_p[local_230._M_string_length - 4] = '\0';
                local_230._M_string_length = local_230._M_string_length - 4;
                ::std::__cxx11::string::append((char *)&local_230);
              }
              iVar11 = 0;
              bVar17 = false;
              iVar16 = 0;
              bVar7 = true;
            }
          }
          else {
            bVar7 = true;
          }
        }
      } while (iVar11 == 0);
      if (iVar11 == 7) {
LAB_003b47d0:
        if (bVar10) {
          local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"@@@","");
          removeSuffix(&local_208,(string *)&local_230,(string *)&local_1c8);
          local_1a8._0_8_ = local_1a8 + 0x10;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1a8,local_208._M_dataplus._M_p,
                     local_208._M_dataplus._M_p + local_208._M_string_length);
          pAVar8 = local_210;
          local_188._M_p = (pointer)local_178;
          local_180 = 0;
          local_178[0]._M_local_buf[0] = '\0';
          ::std::__cxx11::string::operator=((string *)local_210,(string *)local_1a8);
          ::std::__cxx11::string::operator=((string *)&pAVar8->resolved_path_,(string *)&local_188);
          tinyusdz::value::AssetPath::~AssetPath((AssetPath *)local_1a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
            operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
          *triple_deliminated = true;
          bVar10 = true;
        }
        bVar7 = true;
      }
      else {
        bVar10 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,
                        CONCAT62(local_230.field_2._M_allocated_capacity._2_6_,
                                 CONCAT11(local_230.field_2._M_local_buf[1],
                                          local_230.field_2._M_local_buf[0])) + 1);
      }
      if (bVar7) goto LAB_003b469f;
    }
    else {
      pSVar6 = this->_sr;
      if (uVar5 <= pSVar6->length_) {
        pSVar6->idx_ = uVar5;
      }
      uVar5 = pSVar6->idx_ + 1;
      if (pSVar6->length_ < uVar5) {
LAB_003b440a:
        bVar10 = false;
        bVar17 = false;
      }
      else {
        bVar3 = pSVar6->binary_[pSVar6->idx_];
        pSVar6->idx_ = uVar5;
        if ((0x1e < bVar3 - 0x22) || ((0x40000021U >> (bVar3 - 0x22 & 0x1f) & 1) == 0)) {
          local_230._M_string_length = 1;
          local_230.field_2._M_local_buf[1] = '\0';
          local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
          local_230.field_2._M_local_buf[0] = bVar3;
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"ParseAssetIdentifier",0x14);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar13 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x96e);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
          ::std::operator+(&local_1c8,"Asset must start with \'@\', \'\'\' or \'\"\', but got \'",
                           &local_230);
          plVar14 = (long *)::std::__cxx11::string::append((char *)&local_1c8);
          paVar1 = &local_208.field_2;
          psVar15 = (size_type *)(plVar14 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar15) {
            local_208.field_2._M_allocated_capacity = *psVar15;
            local_208.field_2._8_8_ = plVar14[3];
            local_208._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_208.field_2._M_allocated_capacity = *psVar15;
            local_208._M_dataplus._M_p = (pointer)*plVar14;
          }
          local_208._M_string_length = plVar14[1];
          *plVar14 = (long)psVar15;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,local_208._M_dataplus._M_p,
                               local_208._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != paVar1) {
            operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
          ::std::__cxx11::stringbuf::str();
          PushError(this,&local_208);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != paVar1) {
            operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          ::std::ios_base::~ios_base(local_138);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            operator_delete(local_230._M_dataplus._M_p,
                            CONCAT62(local_230.field_2._M_allocated_capacity._2_6_,
                                     CONCAT11(local_230.field_2._M_local_buf[1],
                                              local_230.field_2._M_local_buf[0])) + 1);
          }
          goto LAB_003b440a;
        }
        local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
        local_230._M_string_length = 0;
        local_230.field_2._M_local_buf[0] = 0;
        bVar10 = false;
        local_210 = out;
        local_1d0 = triple_deliminated;
        do {
          pSVar6 = this->_sr;
          uVar5 = pSVar6->idx_;
          if ((pSVar6->length_ <= uVar5) || (pSVar6->binary_[uVar5] == '\0')) goto LAB_003b44c1;
          if (pSVar6->length_ < uVar5 + 1) {
            iVar16 = 1;
LAB_003b449c:
            bVar17 = false;
          }
          else {
            bVar4 = pSVar6->binary_[uVar5];
            pSVar6->idx_ = uVar5 + 1;
            iVar16 = 0;
            if (bVar4 == bVar3) {
              bVar10 = true;
              iVar16 = 5;
              goto LAB_003b449c;
            }
            ::std::__cxx11::string::push_back((char)&local_230);
            bVar17 = true;
          }
        } while (iVar16 == 0);
        if (iVar16 == 5) {
LAB_003b44c1:
          if (bVar10) {
            local_1a8._0_8_ = local_1a8 + 0x10;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)local_1a8,local_230._M_dataplus._M_p,
                       local_230._M_dataplus._M_p + local_230._M_string_length);
            pAVar8 = local_210;
            local_180 = 0;
            local_178[0]._M_local_buf[0] = '\0';
            local_188._M_p = (pointer)local_178;
            ::std::__cxx11::string::operator=((string *)local_210,(string *)local_1a8);
            ::std::__cxx11::string::operator=
                      ((string *)&pAVar8->resolved_path_,(string *)&local_188);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_p != local_178) {
              operator_delete(local_188._M_p,
                              CONCAT71(local_178[0]._M_allocated_capacity._1_7_,
                                       local_178[0]._M_local_buf[0]) + 1);
            }
            pbVar9 = local_1d0;
            if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
              operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
            }
            *pbVar9 = false;
            bVar10 = true;
          }
          bVar17 = true;
        }
        else {
          bVar10 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p,
                          CONCAT62(local_230.field_2._M_allocated_capacity._2_6_,
                                   CONCAT11(local_230.field_2._M_local_buf[1],
                                            local_230.field_2._M_local_buf[0])) + 1);
        }
      }
      if (bVar17) goto LAB_003b469f;
    }
  }
  bVar10 = false;
LAB_003b469f:
  if (local_1e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    operator_delete(local_1e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return bVar10;
}

Assistant:

bool AsciiParser::ParseAssetIdentifier(value::AssetPath *out,
                                       bool *triple_deliminated) {
  // '..' or "..." are also allowed.
  // @...@
  // or @@@...@@@ (Triple '@'-deliminated asset identifier.)
  // @@@ = Path containing '@'. '@@@' in Path is encoded as '\@@@'
  //
  // Example:
  //   @bora@
  //   @@@bora@@@
  //   @@@bora\@@@dora@@@

  // TODO: Correctly support escape characters

  // look ahead.
  std::vector<char> buf;
  uint64_t curr = _sr->tell();
  bool maybe_triple{false};

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  if (CharN(3, &buf)) {
    if (buf[0] == '@' && buf[1] == '@' && buf[2] == '@') {
      maybe_triple = true;
    }
  }

  bool valid{false};

  if (!maybe_triple) {
    // delimiter = " ' @

    SeekTo(curr);
    char s;
    if (!Char1(&s)) {
      return false;
    }

    char delim = s;

    if ((s == '@') || (s == '\'') || (s == '"')) {
      // ok
    } else {
      std::string sstr{s};
      PUSH_ERROR_AND_RETURN(
          "Asset must start with '@', '\'' or '\"', but got '" + sstr + "'");
    }

    std::string tok;

    // Read until next delimiter
    bool found_delimiter = false;
    while (!Eof()) {
      char c;

      if (!Char1(&c)) {
        return false;
      }

      if (c == delim) {
        found_delimiter = true;
        break;
      }

      tok += c;
    }

    if (found_delimiter) {
      (*out) = tok;
      (*triple_deliminated) = false;

      valid = true;
    }

  } else {
    bool found_delimiter{false};
    bool escape_sequence{false};
    int at_cnt{0};
    std::string tok;

    // Read until '@@@' appears
    // Need to escaped '@@@'("\\@@@")
    while (!Eof()) {
      char c;

      if (!Char1(&c)) {
        return false;
      }

      if (c == '\\') {
        escape_sequence = true;
      }

      if (c == '@') {
        at_cnt++;
      } else {
        at_cnt--;
        if (at_cnt < 0) {
          at_cnt = 0;
        }
      }

      tok += c;

      if (at_cnt == 3) {
        if (escape_sequence) {
          // Still in path identifier...
          // Unescape "\\@@@"

          if (tok.size() > 3) {            // this should be true.
            if (endsWith(tok, "\\@@@")) {  // this also should be true.
              tok.erase(tok.size() - 4);
              tok.append("@@@");
            }
          }
          at_cnt = 0;
          escape_sequence = false;
        } else {
          // Got it. '@@@'
          found_delimiter = true;
          break;
        }
      }
    }

    if (found_delimiter) {
      // remote last '@@@'
      (*out) = removeSuffix(tok, "@@@");
      (*triple_deliminated) = true;

      valid = true;
    }
  }

  return valid;
}